

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

string * __thiscall
Lib::Exception::
toString<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
          (Exception *this,char *msg,char *msg_1,char *msg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_3,char *msg_4,
          uint msg_5)

{
  string *in_RDI;
  string *in_R9;
  stringstream out;
  char *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  ostream *in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe60;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe48);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe28,in_R9);
  OutputAll<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int>
  ::apply(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
          in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
          in_stack_fffffffffffffe60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe48);
  return in_RDI;
}

Assistant:

std::string toString(Msg... msg){
    std::stringstream out;
    OutputAll<Msg...>::apply(out, msg...);
    return out.str();
  }